

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Stats::getArrayError
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Stats *this,int index)

{
  pointer pSVar1;
  long lVar2;
  Accumulator *this_00;
  uint uVar3;
  RealType v;
  ResultType RStack_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    pSVar1 = (this->data_).
             super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pSVar1[index].accumulatorArray2d.
                      super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                      ._M_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&pSVar1[index].accumulatorArray2d.
                               super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
                               ._M_impl + 8) - lVar2 >> 3) <= (ulong)uVar3) break;
    this_00 = (Accumulator *)
              __dynamic_cast(*(undefined8 *)(lVar2 + (ulong)uVar3 * 8),&BaseAccumulator::typeinfo,
                             &Accumulator::typeinfo,0);
    Accumulator::get95percentConfidenceInterval(this_00,&RStack_38);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&RStack_38);
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> Stats::getArrayError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    std::vector<RealType> value;
    RealType v;
    for (unsigned int i = 0; i < data_[index].accumulatorArray2d.size(); ++i) {
      dynamic_cast<Accumulator*>(data_[index].accumulatorArray2d[i])
          ->get95percentConfidenceInterval(v);
      value.push_back(v);
    }
    return value;
  }